

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntWeakPtr<Diligent::ISampler> * __thiscall
Diligent::RefCntWeakPtr<Diligent::ISampler>::operator=
          (RefCntWeakPtr<Diligent::ISampler> *this,RefCntAutoPtr<Diligent::ISampler> *AutoPtr)

{
  int iVar1;
  ISampler *pIVar2;
  undefined4 extraout_var;
  RefCountersImpl *local_38;
  RefCntAutoPtr<Diligent::ISampler> *AutoPtr_local;
  RefCntWeakPtr<Diligent::ISampler> *this_local;
  
  Release(this);
  pIVar2 = Diligent::RefCntAutoPtr::operator_cast_to_ISampler_((RefCntAutoPtr *)AutoPtr);
  this->m_pObject = pIVar2;
  if (this->m_pObject == (ISampler *)0x0) {
    local_38 = (RefCountersImpl *)0x0;
  }
  else {
    iVar1 = (*(this->m_pObject->super_IDeviceObject).super_IObject._vptr_IObject[3])();
    local_38 = ClassPtrCast<Diligent::RefCountersImpl,Diligent::IReferenceCounters>
                         ((IReferenceCounters *)CONCAT44(extraout_var,iVar1));
  }
  this->m_pRefCounters = local_38;
  if (this->m_pRefCounters != (RefCountersImpl *)0x0) {
    RefCountersImpl::AddWeakRef(this->m_pRefCounters);
  }
  return this;
}

Assistant:

RefCntWeakPtr& operator=(RefCntAutoPtr<T>& AutoPtr) noexcept
    {
        Release();
        m_pObject      = static_cast<T*>(AutoPtr);
        m_pRefCounters = m_pObject ? ClassPtrCast<RefCountersImpl>(m_pObject->GetReferenceCounters()) : nullptr;
        if (m_pRefCounters)
            m_pRefCounters->AddWeakRef();
        return *this;
    }